

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O1

void game_Run(void)

{
  _Bool _Var1;
  char cVar2;
  int score;
  int iVar3;
  ECommand_t EVar4;
  uint targetIdx;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  
  dd_Init();
  ToExit = '\0';
  ActiveCmd = CMD_NONE;
  tbl_Init();
  ctrl_Init();
  dspl_Init();
  if (ToExit == '\0') {
    do {
      _Var1 = tbl_IsVictory();
      if (_Var1) {
        score = tbl_GetCurrentScore();
        iVar3 = dd_GetHighScore();
        pcVar5 = "CONGRATULATIONS, YOU HAVE WON!!!";
        if (iVar3 < score) {
          pcVar5 = "CONGRATULATIONS, YOU HAVE WON WITH NEW TOP SCORE!!!";
        }
        dspl_SetMessage(pcVar5);
        dspl_Render(CMD_NONE);
        iVar3 = dd_GetHighScore();
        if (iVar3 < score) {
          dd_SetHighScore(score);
        }
        dd_Save();
        cVar2 = dspl_Victory();
        EVar4 = ctrl_KeyToCmd(cVar2);
        if (EVar4 == CMD_EXIT) {
          ToExit = '\x01';
        }
        else {
          ToExit = '\0';
          ActiveCmd = CMD_NONE;
          tbl_Init();
          ctrl_Init();
          dspl_Init();
          dspl_SetMessage("");
        }
        EVar4 = ActiveCmd;
        if (!_Var1) goto LAB_00101f9b;
      }
      else {
LAB_00101f9b:
        dspl_Render(ActiveCmd);
        dspl_SetMessage("");
        cVar2 = input_ReadKey();
        EVar4 = ctrl_KeyToCmd(cVar2);
        switch(EVar4) {
        case CMD_EXIT:
          ToExit = '\x01';
          EVar4 = ActiveCmd;
          break;
        case CMD_RESET:
          ToExit = '\0';
          ActiveCmd = CMD_NONE;
          tbl_Init();
          ctrl_Init();
          dspl_Init();
          EVar4 = ActiveCmd;
          break;
        case CMD_HELP:
          dspl_ShowHelp();
          EVar4 = ActiveCmd;
          break;
        case CMD_SCHEME:
          dspl_ChangeColorScheme();
          EVar4 = ActiveCmd;
          break;
        default:
          if (EVar4 == CMD_HACK) {
            dspl_HackerMode();
            EVar4 = ActiveCmd;
          }
          else if (ActiveCmd == CMD_NONE) {
            if (0xb < EVar4 - CMD_PACK) {
              if (EVar4 != CMD_NEXT) {
                if (EVar4 != CMD_LAZY) goto LAB_001021fd;
                bVar8 = false;
                uVar6 = 0;
                do {
                  bVar7 = false;
                  targetIdx = 0;
                  do {
                    if (((uVar6 != targetIdx) &&
                        (_Var1 = tbl_IsRevealingDeskMove(uVar6,targetIdx), _Var1)) &&
                       (_Var1 = tbl_MoveDeskToDesk(uVar6,targetIdx), _Var1)) {
                      if (!bVar7) {
                        EVar4 = ActiveCmd;
                        if (!bVar8) goto LAB_0010224f;
                        goto LAB_00102194;
                      }
                      break;
                    }
                    bVar7 = 5 < targetIdx;
                    targetIdx = targetIdx + 1;
                  } while (targetIdx != 7);
                  bVar8 = 5 < uVar6;
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 7);
LAB_00102194:
                _Var1 = tbl_MovePackToDesk(0);
                EVar4 = ActiveCmd;
                if (_Var1) break;
                uVar6 = 0xffffffff;
                do {
                  if (uVar6 == 5) goto LAB_001021c9;
                  _Var1 = tbl_MovePackToDesk(uVar6 + 2);
                  uVar6 = uVar6 + 1;
                } while (!_Var1);
                EVar4 = ActiveCmd;
                if (uVar6 < 6) break;
LAB_001021c9:
                _Var1 = tbl_MoveDeskToColors(0);
                EVar4 = ActiveCmd;
                if (_Var1) break;
                uVar6 = 0xffffffff;
                do {
                  if (uVar6 == 5) goto LAB_001021f6;
                  _Var1 = tbl_MoveDeskToColors(uVar6 + 2);
                  uVar6 = uVar6 + 1;
                } while (!_Var1);
                EVar4 = ActiveCmd;
                if (uVar6 < 6) break;
LAB_001021f6:
                _Var1 = tbl_MovePackToColors();
                goto LAB_0010223f;
              }
              tbl_DrawNextCard();
              EVar4 = ActiveCmd;
            }
          }
          else {
            uVar6 = EVar4 - CMD_COLOR0;
            if (uVar6 < 4 || ActiveCmd == EVar4) {
              if (ActiveCmd == CMD_PACK) {
                _Var1 = tbl_MovePackToColors();
              }
              else if (ActiveCmd - CMD_DESK0 < 7) {
                if (3 < uVar6) {
                  uVar6 = 0;
                }
                if (EVar4 - CMD_DESK0 < 7) {
                  uVar6 = EVar4 - CMD_DESK0;
                }
                _Var1 = tbl_MoveDeskToColors(uVar6);
              }
              else {
                _Var1 = false;
              }
              _Var1 = (_Bool)(ActiveCmd == EVar4 | _Var1);
LAB_00102235:
              ActiveCmd = CMD_NONE;
LAB_0010223f:
              EVar4 = ActiveCmd;
              if (_Var1 != false) break;
              pcVar5 = "!! Invalid move";
            }
            else {
              uVar6 = EVar4 - CMD_DESK0;
              if (uVar6 < 7) {
                if (ActiveCmd == CMD_PACK) {
                  _Var1 = tbl_MovePackToDesk(uVar6);
                }
                else if (ActiveCmd - CMD_DESK0 < 7) {
                  _Var1 = tbl_MoveDeskToDesk(ActiveCmd - CMD_DESK0,uVar6);
                }
                else {
                  if (3 < ActiveCmd - CMD_COLOR0) goto LAB_001020bc;
                  _Var1 = tbl_MoveColorsToDesk(ActiveCmd - CMD_COLOR0,uVar6);
                }
                goto LAB_00102235;
              }
              if (EVar4 == CMD_PACK) {
LAB_001020bc:
                _Var1 = false;
                goto LAB_00102235;
              }
              ActiveCmd = CMD_NONE;
LAB_001021fd:
              if (FirstFail == '\0') {
                dspl_SetMessage("!! Invalid key - press H for help");
                FirstFail = '\x01';
                EVar4 = ActiveCmd;
                break;
              }
              pcVar5 = "!! Invalid key";
            }
            dspl_SetMessage(pcVar5);
            EVar4 = ActiveCmd;
          }
        }
      }
LAB_0010224f:
      ActiveCmd = EVar4;
    } while (ToExit != '\x01');
  }
  dd_Save();
  dspl_Clear();
  return;
}

Assistant:

void game_Run(void)
{
  dd_Init();
  InitNewGame();

  while (!ToExit) {
    ECommand_t cmd;
    if (CheckVictory()) {
      // restart or exit game
      continue;
    }
    dspl_Render(ActiveCmd);
    dspl_SetMessage("");

    cmd = ctrl_KeyToCmd(input_ReadKey());

    if (ControlGame(cmd) || ControlDisplay(cmd) || ControlTable(cmd)) {
      continue;
    } else {
      if (FirstFail) {
        dspl_SetMessage("!! Invalid key - press H for help");
        FirstFail = false;
      } else {
        dspl_SetMessage("!! Invalid key");
      }
    }
  }

  dd_Save();
  dspl_Clear();
}